

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

void mk_server_worker_loop(mk_server *server)

{
  mk_event_loop *loop;
  void *pvVar1;
  mk_sched_worker *sched_00;
  ssize_t sVar2;
  mk_sched_conn *pmVar3;
  void *pvVar4;
  mk_event_loop *local_a0;
  mk_event_loop *local_98;
  mk_event_ctx *__ctx_1;
  int __i_1;
  mk_list *__mptr;
  mk_event_ctx *__ctx;
  int __i;
  mk_server_timeout *server_timeout;
  mk_server_listen *listener;
  mk_sched_worker *sched;
  mk_sched_conn *conn;
  mk_list *head;
  mk_list *list;
  mk_event_loop *evl;
  mk_event *event;
  uint64_t val;
  int timeout_fd;
  int ret;
  mk_server *server_local;
  
  val._4_4_ = -1;
  _timeout_fd = server;
  sched_00 = mk_sched_get_thread_conf();
  loop = sched_00->loop;
  mk_event_wait(loop);
  pvVar4 = loop->data;
  if (0 < loop->n_events) {
    evl = *(mk_event_loop **)(*(long *)((long)pvVar4 + 8) + 4);
  }
  __ctx._4_4_ = 0;
  while (__ctx._4_4_ < loop->n_events) {
    if (((((ulong)evl->events & 1) != 0) && (evl->n_events == 0)) &&
       (evl->size == sched_00->signal_channel_r)) {
      sVar2 = read(evl->size,&event,8);
      val._4_4_ = (int)sVar2;
      if (val._4_4_ < 0) {
        mk_utils_libc_error("read",
                            "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_server.c"
                            ,0x1d6);
      }
      else if (event == (mk_event *)0xeeeeeeee) break;
    }
    __ctx._4_4_ = __ctx._4_4_ + 1;
    if (__ctx._4_4_ < loop->n_events) {
      local_98 = *(mk_event_loop **)(*(long *)((long)pvVar4 + 8) + (long)__ctx._4_4_ * 0xc + 4);
    }
    else {
      local_98 = (mk_event_loop *)0x0;
    }
    evl = local_98;
  }
  if (_timeout_fd->scheduler_mode == '\x01') {
    pmVar3 = (mk_sched_conn *)pthread_getspecific(mk_tls_server_listen);
    for (conn = *(mk_sched_conn **)&(pmVar3->event).mask; conn != pmVar3;
        conn = *(mk_sched_conn **)&(conn->event).mask) {
      mk_event_add(sched_00->loop,*(int *)&conn[-1].channel.thread,1,1,&conn[-1].protocol);
    }
  }
  if (_timeout_fd->lib_mode == 1) {
    mk_server_fifo_worker_setup(loop);
  }
  pvVar4 = mk_mem_alloc_z(0x48);
  pthread_setspecific(mk_tls_server_timeout,pvVar4);
  val._0_4_ = mk_event_timeout_create(loop,(long)_timeout_fd->timeout,0,pvVar4);
  do {
    mk_event_wait(loop);
    pvVar1 = loop->data;
    if (0 < loop->n_events) {
      evl = *(mk_event_loop **)(*(long *)((long)pvVar1 + 8) + 4);
    }
    __ctx_1._4_4_ = 0;
    while (__ctx_1._4_4_ < loop->n_events) {
      val._4_4_ = 0;
      if ((evl->n_events & 0x18U) == 0) {
        if (evl->n_events == 3) {
          if (((ulong)evl->events & 4) != 0) {
            val._4_4_ = mk_sched_event_write((mk_sched_conn *)evl,sched_00,_timeout_fd);
          }
          if (((ulong)evl->events & 1) != 0) {
            val._4_4_ = mk_sched_event_read((mk_sched_conn *)evl,sched_00,_timeout_fd);
          }
          if ((((ulong)evl->events & 0x2018) != 0) && (val._4_4_ != -1)) {
            val._4_4_ = -1;
          }
          if ((val._4_4_ < 0) && (evl[3].size != -2)) {
            mk_sched_event_close((mk_sched_conn *)evl,sched_00,0,_timeout_fd);
          }
        }
        else if (evl->n_events == 1) {
          mk_server_listen_handler(sched_00,evl,_timeout_fd);
        }
        else if (evl->n_events == 4) {
          (**(code **)(evl + 1))(evl);
        }
        else if (evl->n_events == 0) {
          sVar2 = read(evl->size,&event,8);
          val._4_4_ = (int)sVar2;
          if (val._4_4_ < 0) {
            mk_utils_libc_error("read",
                                "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_server.c"
                                ,0x238);
          }
          else if (evl->size == sched_00->signal_channel_r) {
            if ((event != (mk_event *)0xdeadbeef) && (event == (mk_event *)0xffee0000)) {
              if (0 < (int)val) {
                mk_event_timeout_destroy(loop,pvVar4);
              }
              pvVar4 = pthread_getspecific(mk_tls_server_timeout);
              mk_mem_free(pvVar4);
              mk_server_listen_exit(sched_00->listeners);
              mk_event_loop_destroy(loop);
              mk_sched_worker_free(_timeout_fd);
              return;
            }
          }
          else if (evl->size == (int)val) {
            mk_sched_check_timeouts(sched_00,_timeout_fd);
          }
        }
        else if (evl->n_events == 5) {
          mk_http_thread_event((mk_event *)evl);
        }
        else if (evl->n_events == 2) {
          mk_fifo_worker_read(evl);
        }
      }
      __ctx_1._4_4_ = __ctx_1._4_4_ + 1;
      if (__ctx_1._4_4_ < loop->n_events) {
        local_a0 = *(mk_event_loop **)(*(long *)((long)pvVar1 + 8) + (long)__ctx_1._4_4_ * 0xc + 4);
      }
      else {
        local_a0 = (mk_event_loop *)0x0;
      }
      evl = local_a0;
    }
    mk_sched_threads_purge(sched_00);
    mk_sched_event_free_all(sched_00);
  } while( true );
}

Assistant:

void mk_server_worker_loop(struct mk_server *server)
{
    int ret = -1;
    int timeout_fd;
    uint64_t val;
    struct mk_event *event;
    struct mk_event_loop *evl;
    struct mk_list *list;
    struct mk_list *head;
    struct mk_sched_conn *conn;
    struct mk_sched_worker *sched;
    struct mk_server_listen *listener;
    struct mk_server_timeout *server_timeout;

    /* Get thread conf */
    sched = mk_sched_get_thread_conf();
    evl = sched->loop;

    /*
     * The worker will NOT process any connection until the master
     * process through mk_server_loop() send us the green light
     * signal MK_SERVER_SIGNAL_START.
     */
    mk_event_wait(evl);
    mk_event_foreach(event, evl) {
        if ((event->mask & MK_EVENT_READ) &&
            event->type == MK_EVENT_NOTIFICATION) {
            if (event->fd == sched->signal_channel_r) {
        /* When using libevent _mk_event_channel_create creates a unix socket
         * instead of a pipe and windows doesn't us calling read / write on a
         * socket instead of recv / send
         */
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }
                if (val == MK_SERVER_SIGNAL_START) {
                    MK_TRACE("Worker %i started (SIGNAL_START)", sched->idx);
                    break;
                }
            }
        }
    }

    if (server->scheduler_mode == MK_SCHEDULER_REUSEPORT) {
        /* Register listeners */
        list = MK_TLS_GET(mk_tls_server_listen);
        mk_list_foreach(head, list) {
            listener = mk_list_entry(head, struct mk_server_listen, _head);
            mk_event_add(sched->loop, listener->server_fd,
                         MK_EVENT_LISTENER, MK_EVENT_READ,
                         listener);
        }
    }

    /*
     * If running in library mode, register the FIFO pipe file descriptors
     * into the main event loop.
     */
    if (server->lib_mode == MK_TRUE) {
        mk_server_fifo_worker_setup(evl);
    }

    /* create a new timeout file descriptor */
    server_timeout = mk_mem_alloc_z(sizeof(struct mk_server_timeout));
    MK_TLS_SET(mk_tls_server_timeout, server_timeout);
    timeout_fd = mk_event_timeout_create(evl, server->timeout, 0, server_timeout);

    while (1) {
        mk_event_wait(evl);
        mk_event_foreach(event, evl) {
            ret = 0;
            if (event->type & MK_EVENT_IDLE) {
                continue;
            }

            if (event->type == MK_EVENT_CONNECTION) {
                conn = (struct mk_sched_conn *) event;

                if (event->mask & MK_EVENT_WRITE) {
                    MK_TRACE("[FD %i] Event WRITE", event->fd);
                    ret = mk_sched_event_write(conn, sched, server);
                }

                if (event->mask & MK_EVENT_READ) {
                    MK_TRACE("[FD %i] Event READ", event->fd);
                    ret = mk_sched_event_read(conn, sched, server);
                }


                if (event->mask & MK_EVENT_CLOSE && ret != -1) {
                    MK_TRACE("[FD %i] Event CLOSE", event->fd);
                    ret = -1;
                }

                if (ret < 0 && conn->status != MK_SCHED_CONN_CLOSED) {
                    MK_TRACE("[FD %i] Event FORCE CLOSE | ret = %i",
                             event->fd, ret);
                    mk_sched_event_close(conn, sched, MK_EP_SOCKET_CLOSED,
                                         server);
                }
            }
            else if (event->type == MK_EVENT_LISTENER) {
                /*
                 * A new connection have been accepted..or failed, despite
                 * the result, we let the loop continue processing the other
                 * events triggered.
                 */
                conn = mk_server_listen_handler(sched, event, server);
                if (conn) {
                    //conn->event.mask = MK_EVENT_READ
                    //goto speed;
                }
                continue;
            }
            else if (event->type == MK_EVENT_CUSTOM) {
                /*
                 * We got an event associated to a custom interface, that
                 * means a plugin registered some file descriptor on this
                 * event loop and an event was triggered. We pass the control
                 * to the defined event handler.
                 */
                event->handler(event);
            }
            else if (event->type == MK_EVENT_NOTIFICATION) {
#ifdef _WIN32
                ret = recv(event->fd, &val, sizeof(val), MSG_WAITALL);
#else
                ret = read(event->fd, &val, sizeof(val));
#endif
                if (ret < 0) {
                    mk_libc_error("read");
                    continue;
                }

                if (event->fd == sched->signal_channel_r) {
                    if (val == MK_SCHED_SIGNAL_DEADBEEF) {
                        //FIXME:mk_sched_sync_counters();
                        continue;
                    }
                    else if (val == MK_SCHED_SIGNAL_FREE_ALL) {
                        if (timeout_fd > 0) {
                            mk_event_timeout_destroy(evl, server_timeout);
                        }
                        mk_mem_free(MK_TLS_GET(mk_tls_server_timeout));
                        mk_server_listen_exit(sched->listeners);
                        mk_event_loop_destroy(evl);
                        mk_sched_worker_free(server);
                        return;
                    }
                    else if (val == MK_SCHED_SIGNAL_EVENT_LOOP_BREAK) {
                        /* NOTE: This is just a notification that's sent to break out
                         *       of the libevent loop in windows after accepting a new
                         *       client
                        */
                        MK_TRACE("New client accepted, awesome!");
                    }
                }
                else if (event->fd == timeout_fd) {
                    mk_sched_check_timeouts(sched, server);
                }
                continue;
            }
            else if (event->type == MK_EVENT_THREAD) {
                mk_http_thread_event(event);
                continue;
            }
            else if (event->type == MK_EVENT_FIFO) {
                mk_fifo_worker_read(event);
                continue;
            }
        }
        mk_sched_threads_purge(sched);
        mk_sched_event_free_all(sched);
    }
}